

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOptimizationTests.cpp
# Opt level: O0

string * deqp::gles2::Performance::anon_unknown_1::DeadCodeEliminationCase::
         deadBranchComplexCaseStatements
                   (string *__return_storage_ptr__,bool optimized,string *precision,bool useConst,
                   bool useHeavierWorkload)

{
  char *__s;
  string local_278;
  byte local_256;
  byte local_255;
  byte local_254;
  byte local_253;
  byte local_252;
  byte local_251;
  byte local_250;
  byte local_24f;
  byte local_24e;
  byte local_24d;
  byte local_24c;
  byte local_24b;
  byte local_24a;
  byte local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  byte local_62;
  allocator<char> local_61;
  int local_60 [2];
  int numLoopIterations;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string constMaybe;
  bool useHeavierWorkload_local;
  bool useConst_local;
  string *precision_local;
  bool optimized_local;
  
  __s = "";
  if (useConst) {
    __s = "const ";
  }
  constMaybe.field_2._M_local_buf[0xe] = useHeavierWorkload;
  constMaybe.field_2._M_local_buf[0xf] = useConst;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,__s,&local_49);
  std::allocator<char>::~allocator(&local_49);
  local_60[0] = 4;
  if ((constMaybe.field_2._M_local_buf[0xe] & 1U) != 0) {
    local_60[0] = 0x10;
  }
  local_62 = 0;
  local_249 = 0;
  local_24a = 0;
  local_24b = 0;
  local_24c = 0;
  local_24d = 0;
  local_24e = 0;
  local_24f = 0;
  local_250 = 0;
  local_251 = 0;
  local_252 = 0;
  local_253 = 0;
  local_254 = 0;
  local_255 = 0;
  local_256 = 0;
  if (optimized) {
    std::allocator<char>::allocator();
    local_62 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"\tvalue = vec4(0.6, 0.7, 0.8, 0.9) * value;\n",
               &local_61);
  }
  else {
    std::operator+(&local_248,"\tvalue = vec4(0.6, 0.7, 0.8, 0.9) * value;\n\t",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    local_249 = 1;
    std::operator+(&local_228,&local_248,precision);
    local_24a = 1;
    std::operator+(&local_208,&local_228,
                   " vec4 a = vec4(sin(0.7), cos(0.2), sin(0.9), abs(-0.5));\n\t");
    local_24b = 1;
    std::operator+(&local_1e8,&local_208,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    local_24c = 1;
    std::operator+(&local_1c8,&local_1e8,precision);
    local_24d = 1;
    std::operator+(&local_1a8,&local_1c8," vec4 b = cos(a) + fract(3.0*a.xzzw);\n\t");
    local_24e = 1;
    std::operator+(&local_188,&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    local_24f = 1;
    std::operator+(&local_168,&local_188,"bvec4 c = bvec4(true, false, true, true);\n\t");
    local_250 = 1;
    std::operator+(&local_148,&local_168,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    local_251 = 1;
    std::operator+(&local_128,&local_148,precision);
    local_252 = 1;
    std::operator+(&local_108,&local_128," vec4 d = exp(b + vec4(c));\n\t");
    local_253 = 1;
    std::operator+(&local_e8,&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    local_254 = 1;
    std::operator+(&local_c8,&local_e8,precision);
    local_255 = 1;
    std::operator+(&local_a8,&local_c8,
                   " vec4 e = 1.8*abs(sin(sin(inversesqrt(mix(d+a, d+b, a)))));\n\tif (e.x > 1.0)\n\t{\n\t\tvalue = cos(exp(sin(value))*log(sqrt(value)));\n\t\tfor (int i = 0; i < "
                  );
    local_256 = 1;
    de::toString<int>(&local_278,local_60);
    std::operator+(&local_88,&local_a8,&local_278);
    std::operator+(__return_storage_ptr__,&local_88,"; i++)\n\t\t\tvalue = sin(value);\n\t}\n");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_278);
  }
  if ((local_256 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((local_255 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((local_254 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_e8);
  }
  if ((local_253 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_108);
  }
  if ((local_252 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_128);
  }
  if ((local_251 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_148);
  }
  if ((local_250 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_168);
  }
  if ((local_24f & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_188);
  }
  if ((local_24e & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  if ((local_24d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  if ((local_24c & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  if ((local_24b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_208);
  }
  if ((local_24a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_228);
  }
  if ((local_249 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_248);
  }
  if ((local_62 & 1) != 0) {
    std::allocator<char>::~allocator(&local_61);
  }
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

static inline string deadBranchComplexCaseStatements (bool optimized, const string& precision, bool useConst, bool useHeavierWorkload)
	{
		const string	constMaybe			= useConst ? "const " : "";
		const int		numLoopIterations	= useHeavierWorkload ? 16 : 4;

		return optimized ?	"	value = vec4(0.6, 0.7, 0.8, 0.9) * value;\n"

						 :	"	value = vec4(0.6, 0.7, 0.8, 0.9) * value;\n"
							"	" + constMaybe + precision + " vec4 a = vec4(sin(0.7), cos(0.2), sin(0.9), abs(-0.5));\n"
							"	" + constMaybe + precision + " vec4 b = cos(a) + fract(3.0*a.xzzw);\n"
							"	" + constMaybe + "bvec4 c = bvec4(true, false, true, true);\n"
							"	" + constMaybe + precision + " vec4 d = exp(b + vec4(c));\n"
							"	" + constMaybe + precision + " vec4 e = 1.8*abs(sin(sin(inversesqrt(mix(d+a, d+b, a)))));\n"
							"	if (e.x > 1.0)\n"
							"	{\n"
							"		value = cos(exp(sin(value))*log(sqrt(value)));\n"
							"		for (int i = 0; i < " + toString(numLoopIterations) + "; i++)\n"
							"			value = sin(value);\n"
							"	}\n";
	}